

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Bool prvTidyFixXmlDecl(TidyDocImpl *doc)

{
  AttVal *pAVar1;
  AttVal *pAVar2;
  ctmbstr value;
  ctmbstr enc;
  Node *root;
  Lexer *lexer;
  AttVal *encoding;
  AttVal *version;
  Node *xml;
  TidyDocImpl *doc_local;
  
  if (((doc->root).content == (Node *)0x0) || (((doc->root).content)->type != XmlDecl)) {
    version = (AttVal *)prvTidyNewNode(doc->lexer->allocator,doc->lexer);
    ((Node *)version)->type = XmlDecl;
    if ((doc->root).content == (Node *)0x0) {
      (doc->root).content = (Node *)version;
    }
    else {
      prvTidyInsertNodeBeforeElement((doc->root).content,(Node *)version);
    }
  }
  else {
    version = (AttVal *)(doc->root).content;
  }
  pAVar1 = prvTidyGetAttrByName((Node *)version,"version");
  pAVar2 = prvTidyGetAttrByName((Node *)version,"encoding");
  if (((pAVar2 == (AttVal *)0x0) && ((doc->config).value[0x3c].v != 4)) &&
     (value = prvTidyGetEncodingNameFromTidyId((uint)(doc->config).value[0x3c].v),
     value != (ctmbstr)0x0)) {
    prvTidyAddAttribute(doc,(Node *)version,"encoding",value);
  }
  if (pAVar1 == (AttVal *)0x0) {
    prvTidyAddAttribute(doc,(Node *)version,"version","1.0");
  }
  return yes;
}

Assistant:

Bool TY_(FixXmlDecl)( TidyDocImpl* doc )
{
    Node* xml;
    AttVal *version, *encoding;
    Lexer*lexer = doc->lexer;
    Node* root = &doc->root;

    if ( root->content && root->content->type == XmlDecl )
    {
        xml = root->content;
    }
    else
    {
        xml = TY_(NewNode)(lexer->allocator, lexer);
        xml->type = XmlDecl;
        if ( root->content )
            TY_(InsertNodeBeforeElement)(root->content, xml);
        else
            root->content = xml;
    }

    version = TY_(GetAttrByName)(xml, "version");
    encoding = TY_(GetAttrByName)(xml, "encoding");

    /*
      We need to insert a check if declared encoding 
      and output encoding mismatch and fix the XML
      declaration accordingly!!!
    */

    if ( encoding == NULL && cfg(doc, TidyOutCharEncoding) != UTF8 )
    {
        ctmbstr enc = TY_(GetEncodingNameFromTidyId)(cfg(doc, TidyOutCharEncoding));
        if ( enc )
            TY_(AddAttribute)( doc, xml, "encoding", enc );
    }

    if ( version == NULL )
        TY_(AddAttribute)( doc, xml, "version", "1.0" );
    return yes;
}